

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createLoad
          (Builder *this,Id lValue,Decoration precision,MemoryAccessMask memoryAccess,Scope scope,
          uint alignment)

{
  Instruction *pIVar1;
  Id IVar2;
  StorageClass SVar3;
  Instruction *this_00;
  Id IVar4;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  this_00 = (Instruction *)operator_new(0x60);
  IVar4 = this->uniqueId + 1;
  this->uniqueId = IVar4;
  IVar2 = getDerefTypeId(this,lValue);
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
  this_00->resultId = IVar4;
  this_00->typeId = IVar2;
  this_00->opCode = OpLoad;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  IVar2 = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00->block = (Block *)0x0;
  Instruction::addIdOperand(this_00,lValue);
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[lValue];
  if (pIVar1 != (Instruction *)0x0) {
    IVar2 = pIVar1->typeId;
  }
  SVar3 = Module::getStorageClass(&this->module,IVar2);
  if (((StorageBuffer < SVar3) || ((0x1014U >> (SVar3 & 0x1f) & 1) == 0)) &&
     (SVar3 != PhysicalStorageBuffer)) {
    memoryAccess = memoryAccess &
                   ~(MemoryAccessNonPrivatePointerKHRMask|MakePointerVisible|MakePointerAvailable);
  }
  if (memoryAccess != MaskNone) {
    Instruction::addImmediateOperand(this_00,memoryAccess);
    if ((memoryAccess & Aligned) != MaskNone) {
      Instruction::addImmediateOperand(this_00,alignment);
    }
    if ((memoryAccess & MakePointerVisible) != MaskNone) {
      IVar2 = makeIntegerType(this,0x20,false);
      IVar2 = makeIntConstant(this,IVar2,scope,false);
      Instruction::addIdOperand(this_00,IVar2);
    }
  }
  local_38._M_head_impl = this_00;
  addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  IVar2 = this_00->resultId;
  if (IVar2 != 0 && precision != DecorationMax) {
    addDecoration(this,IVar2,precision,-1);
    IVar2 = this_00->resultId;
  }
  return IVar2;
}

Assistant:

Id Builder::createLoad(Id lValue, spv::Decoration precision, spv::MemoryAccessMask memoryAccess,
    spv::Scope scope, unsigned int alignment)
{
    Instruction* load = new Instruction(getUniqueId(), getDerefTypeId(lValue), OpLoad);
    load->addIdOperand(lValue);

    memoryAccess = sanitizeMemoryAccessForStorageClass(memoryAccess, getStorageClass(lValue));

    if (memoryAccess != MemoryAccessMaskNone) {
        load->addImmediateOperand(memoryAccess);
        if (memoryAccess & spv::MemoryAccessAlignedMask) {
            load->addImmediateOperand(alignment);
        }
        if (memoryAccess & spv::MemoryAccessMakePointerVisibleKHRMask) {
            load->addIdOperand(makeUintConstant(scope));
        }
    }

    addInstruction(std::unique_ptr<Instruction>(load));
    setPrecision(load->getResultId(), precision);

    return load->getResultId();
}